

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeHalt(Vdbe *p)

{
  byte *pbVar1;
  u8 uVar2;
  sqlite3 *db;
  VdbeFrame *pVVar3;
  VTable **ppVVar4;
  sqlite3_vtab *pVtab;
  _func_int_sqlite3_vtab_ptr *p_Var5;
  Btree *pBVar6;
  Pager *pPVar7;
  sqlite3_vfs *pVfs;
  long lVar8;
  char *z;
  bool bVar9;
  bool bVar10;
  sqlite3_file *pFile;
  byte bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  VdbeFrame *pFrame;
  char *zFile;
  uint uVar16;
  char *pcVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  VdbeFrame *pDel;
  uint local_50;
  int res;
  long local_48;
  sqlite3_file *pSuperJrnl;
  long local_38;
  
  db = p->db;
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  pVVar3 = p->pFrame;
  if (p->pFrame != (VdbeFrame *)0x0) {
    do {
      pFrame = pVVar3;
      pVVar3 = pFrame->pParent;
    } while (pVVar3 != (VdbeFrame *)0x0);
    sqlite3VdbeFrameRestore(pFrame);
    p->pFrame = (VdbeFrame *)0x0;
    p->nFrame = 0;
  }
  closeCursorsInFrame(p);
  releaseMemArray(p->aMem,p->nMem);
  while (pVVar3 = p->pDelFrame, pVVar3 != (VdbeFrame *)0x0) {
    p->pDelFrame = pVVar3->pParent;
    iVar15 = pVVar3->nChildMem;
    for (lVar20 = 0; lVar20 < pVVar3->nChildCsr; lVar20 = lVar20 + 1) {
      if ((&pVVar3[1].v)[(long)iVar15 * 7 + lVar20] != (Vdbe *)0x0) {
        sqlite3VdbeFreeCursorNN(pVVar3->v,(VdbeCursor *)(&pVVar3[1].v)[(long)iVar15 * 7 + lVar20]);
      }
    }
    releaseMemArray((Mem *)(pVVar3 + 1),pVVar3->nChildMem);
    sqlite3VdbeDeleteAuxData(pVVar3->v->db,&pVVar3->pAuxData,-1,0);
    sqlite3DbFreeNN(pVVar3->v->db,pVVar3);
  }
  if (p->pAuxData != (AuxData *)0x0) {
    sqlite3VdbeDeleteAuxData(p->db,&p->pAuxData,-1,0);
  }
  if (-1 < (char)p->field_0xc6) goto LAB_00130d70;
  sqlite3VdbeEnter(p);
  uVar14 = p->rc;
  bVar9 = false;
  if (uVar14 == 0) {
LAB_00130668:
    sqlite3VdbeCheckFk(p,0);
    bVar10 = true;
    iVar15 = 0;
  }
  else {
    bVar11 = (byte)uVar14;
    if ((bVar11 < 0xe) && ((0x2680U >> (uVar14 & 0x1f) & 1) != 0)) {
      bVar9 = true;
      iVar15 = 0;
      if ((bVar11 == 9 & (p->field_0xc6 & 0x40) >> 6) == 0) {
        if (((bVar11 == 0xd) || ((uVar14 & 0xff) == 7)) && ((p->field_0xc6 & 0x20) != 0)) {
          iVar15 = 2;
          bVar10 = false;
        }
        else {
          sqlite3RollbackAll(db,0x204);
          sqlite3CloseSavepoints(db);
          db->autoCommit = '\x01';
          p->nChange = 0;
          bVar9 = true;
          bVar10 = true;
          iVar15 = 0;
          if (p->rc == 0) goto LAB_00130668;
        }
      }
      else {
        bVar10 = true;
      }
    }
    else {
      bVar10 = true;
      bVar9 = false;
      iVar15 = 0;
      if (p->errorAction == '\x03') goto LAB_00130668;
    }
  }
  if (((db->nVTrans < 1) || (db->aVTrans != (VTable **)0x0)) &&
     ((db->autoCommit != '\0' && (db->nVdbeWrite == (uint)((p->field_0xc6 & 0x40) == 0))))) {
    if ((p->rc == 0) || (!bVar9 && p->errorAction == '\x03')) {
      iVar12 = sqlite3VdbeCheckFk(p,1);
      if (iVar12 == 0) {
        if ((db->flags >> 0x21 & 1) == 0) {
          ppVVar4 = db->aVTrans;
          db->aVTrans = (VTable **)0x0;
          iVar12 = 0;
          for (lVar20 = 0; (iVar12 == 0 && (lVar20 < db->nVTrans)); lVar20 = lVar20 + 1) {
            pVtab = ppVVar4[lVar20]->pVtab;
            iVar12 = 0;
            if ((pVtab != (sqlite3_vtab *)0x0) &&
               (p_Var5 = pVtab->pModule->xSync, p_Var5 != (_func_int_sqlite3_vtab_ptr *)0x0)) {
              iVar12 = (*p_Var5)(pVtab);
              sqlite3VtabImportErrmsg(p,pVtab);
            }
          }
          db->aVTrans = ppVVar4;
          lVar18 = 0;
          lVar20 = 0;
          bVar9 = false;
          iVar19 = 0;
LAB_001307fb:
          if (iVar12 == 0) {
            if (lVar20 < db->nDb) goto code_r0x00130811;
            if ((bVar9) && (db->xCommitCallback != (_func_int_void_ptr *)0x0)) {
              iVar13 = (*db->xCommitCallback)(db->pCommitArg);
              iVar12 = 0x213;
              if (iVar13 != 0) goto LAB_00130ca8;
            }
            pPVar7 = db->aDb->pBt->pBt->pPager;
            uVar2 = pPVar7->memDb;
            if (uVar2 == '\0') {
              pcVar17 = pPVar7->zFilename;
            }
            else {
              pcVar17 = (char *)((long)&sqlite3PagerFilename_zFake + 4);
            }
            iVar12 = sqlite3Strlen30(pcVar17);
            if ((iVar12 == 0) || (iVar19 < 2)) {
              lVar20 = 8;
              iVar12 = 0;
              for (lVar18 = 0; (iVar12 == 0 && (lVar18 < db->nDb)); lVar18 = lVar18 + 1) {
                pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar20);
                if (pBVar6 == (Btree *)0x0) {
                  iVar12 = 0;
                }
                else {
                  iVar12 = sqlite3BtreeCommitPhaseOne(pBVar6,(char *)0x0);
                }
                lVar20 = lVar20 + 0x20;
              }
              lVar20 = 8;
              lVar18 = 0;
              while (iVar12 == 0) {
                if (db->nDb <= lVar18) goto LAB_00130e50;
                pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar20);
                if (pBVar6 == (Btree *)0x0) {
                  iVar12 = 0;
                }
                else {
                  iVar12 = sqlite3BtreeCommitPhaseTwo(pBVar6,0);
                }
                lVar18 = lVar18 + 1;
                lVar20 = lVar20 + 0x20;
              }
              goto LAB_00130c89;
            }
            if (uVar2 == '\0') {
              pcVar17 = pPVar7->zFilename;
            }
            else {
              pcVar17 = (char *)((long)&sqlite3PagerFilename_zFake + 4);
            }
            pVfs = db->pVfs;
            pSuperJrnl = (sqlite3_file *)0x0;
            uVar14 = sqlite3Strlen30(pcVar17);
            pcVar17 = sqlite3MPrintf(db,"%.4c%s%.16c",0,pcVar17);
            if (pcVar17 != (char *)0x0) {
              zFile = pcVar17 + 4;
              uVar16 = 0;
              goto LAB_001309f4;
            }
            iVar12 = 7;
          }
          goto LAB_00130c89;
        }
        db->flags = db->flags & 0xfffffffdffffffff;
        iVar12 = 0xb;
      }
      else {
        iVar12 = 0x313;
        if ((p->field_0xc6 & 0x40) != 0) {
          sqlite3VdbeLeave(p);
          return 1;
        }
      }
      goto LAB_00130ca8;
    }
    sqlite3RollbackAll(db,0);
    p->nChange = 0;
    goto LAB_00130cc4;
  }
  if (((!bVar10) || (iVar15 = 1, p->rc == 0)) || (p->errorAction == '\x03')) goto LAB_00130cd3;
  if (p->errorAction == '\x02') {
    iVar15 = 2;
    goto LAB_00130cd3;
  }
  sqlite3RollbackAll(db,0x204);
  sqlite3CloseSavepoints(db);
  iVar12 = 0;
LAB_00130d35:
  db->autoCommit = '\x01';
  p->nChange = 0;
  goto LAB_00130d42;
code_r0x00130811:
  pBVar6 = *(Btree **)((long)&db->aDb->pBt + lVar18);
  iVar12 = 0;
  if ((pBVar6 != (Btree *)0x0) && (pBVar6->inTrans == '\x02')) {
    sqlite3BtreeEnter(pBVar6);
    pPVar7 = pBVar6->pBt->pPager;
    if (((&db->aDb->safety_level)[lVar18] != '\x01') &&
       (((0x34UL >> ((ulong)pPVar7->journalMode & 0x3f) & 1) == 0 && (pPVar7->tempFile == '\0')))) {
      iVar19 = iVar19 + (uint)(pPVar7->memVfs == '\0');
    }
    iVar12 = sqlite3PagerExclusiveLock(pPVar7);
    sqlite3BtreeLeave(pBVar6);
    bVar9 = true;
  }
  lVar20 = lVar20 + 1;
  lVar18 = lVar18 + 0x20;
  goto LAB_001307fb;
code_r0x00130bf3:
  pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar20);
  if (pBVar6 == (Btree *)0x0) {
    iVar12 = 0;
  }
  else {
    iVar12 = sqlite3BtreeCommitPhaseOne(pBVar6,zFile);
  }
  lVar18 = lVar18 + 1;
  lVar20 = lVar20 + 0x20;
  goto LAB_00130be1;
  while( true ) {
    sqlite3_randomness(4,&local_50);
    sqlite3_snprintf(0xd,pcVar17 + (ulong)uVar14 + 4,"-mj%06X9%02X",(ulong)(local_50 >> 8));
    iVar12 = (*pVfs->xAccess)(pVfs,zFile,0,&res);
    if ((iVar12 != 0) || (uVar16 = uVar16 + 1, res == 0)) break;
LAB_001309f4:
    if (uVar16 != 0) {
      if (100 < uVar16) {
        sqlite3_log(0xd,"MJ delete: %s",zFile);
        if (pVfs->xDelete != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
          (*pVfs->xDelete)(pVfs,zFile,0);
        }
        goto LAB_00130aab;
      }
      if (uVar16 == 1) {
        sqlite3_log(0xd,"MJ collide: %s",zFile);
      }
    }
  }
  if (iVar12 == 0) {
LAB_00130aab:
    iVar12 = sqlite3OsOpenMalloc(pVfs,zFile,&pSuperJrnl,0x4016,(int *)0x0);
    pFile = pSuperJrnl;
    if (iVar12 == 0) {
      local_48 = 0;
      lVar20 = 8;
      for (lVar18 = 0; lVar18 < db->nDb; lVar18 = lVar18 + 1) {
        lVar8 = *(long *)((long)&db->aDb->zDbSName + lVar20);
        if (((lVar8 != 0) && (*(char *)(lVar8 + 0x10) == '\x02')) &&
           (z = *(char **)(**(long **)(lVar8 + 8) + 0xe0), z != (char *)0x0)) {
          local_38 = lVar20;
          iVar12 = sqlite3Strlen30(z);
          lVar20 = local_48;
          iVar12 = (*pFile->pMethods->xWrite)(pFile,z,iVar12 + 1,local_48);
          uVar14 = sqlite3Strlen30(z);
          if (iVar12 != 0) {
            sqlite3OsCloseFree(pFile);
            if (pVfs->xDelete != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
              (*pVfs->xDelete)(pVfs,zFile,0);
            }
            goto LAB_00130c7e;
          }
          local_48 = lVar20 + (ulong)uVar14 + 1;
          lVar20 = local_38;
        }
        lVar20 = lVar20 + 0x20;
      }
      uVar14 = (*pFile->pMethods->xDeviceCharacteristics)(pFile);
      if (((uVar14 >> 10 & 1) == 0) && (iVar12 = (*pFile->pMethods->xSync)(pFile,2), iVar12 != 0)) {
        sqlite3OsCloseFree(pFile);
        if (pVfs->xDelete != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
          (*pVfs->xDelete)(pVfs,zFile,0);
        }
      }
      else {
        lVar18 = 0;
        lVar20 = 8;
        iVar12 = 0;
LAB_00130be1:
        if (iVar12 == 0) {
          if (lVar18 < db->nDb) goto code_r0x00130bf3;
          sqlite3OsCloseFree(pFile);
          if (pVfs->xDelete == (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
            iVar12 = 0;
          }
          else {
            iVar12 = (*pVfs->xDelete)(pVfs,zFile,1);
          }
          sqlite3DbFreeNN(db,pcVar17);
          if (iVar12 == 0) {
            if (sqlite3Hooks_0 != (code *)0x0) {
              (*sqlite3Hooks_0)();
            }
            lVar20 = 8;
            for (lVar18 = 0; lVar18 < db->nDb; lVar18 = lVar18 + 1) {
              pBVar6 = *(Btree **)((long)&db->aDb->zDbSName + lVar20);
              if (pBVar6 != (Btree *)0x0) {
                sqlite3BtreeCommitPhaseTwo(pBVar6,1);
              }
              lVar20 = lVar20 + 0x20;
            }
            if (sqlite3Hooks_1 != (code *)0x0) {
              (*sqlite3Hooks_1)();
            }
LAB_00130e50:
            sqlite3VtabCommit(db);
            db->nDeferredCons = 0;
            db->nDeferredImmCons = 0;
            pbVar1 = (byte *)((long)&db->flags + 2);
            *pbVar1 = *pbVar1 & 0xf7;
            *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xfe;
            goto LAB_00130cc4;
          }
          goto LAB_00130c89;
        }
        sqlite3OsCloseFree(pFile);
      }
    }
  }
LAB_00130c7e:
  sqlite3DbFreeNN(db,pcVar17);
LAB_00130c89:
  if (iVar12 == 5) {
    if ((p->field_0xc6 & 0x40) != 0) {
      sqlite3VdbeLeave(p);
      return 5;
    }
    iVar12 = 5;
  }
LAB_00130ca8:
  p->rc = iVar12;
  sqlite3RollbackAll(db,0);
  p->nChange = 0;
LAB_00130cc4:
  db->nStatement = 0;
  iVar12 = 0;
  if (!bVar10) {
LAB_00130cd3:
    iVar12 = iVar15;
    if (((p->db->nStatement != 0) && (p->iStatement != 0)) &&
       (iVar15 = vdbeCloseStatement(p,iVar12), iVar15 != 0)) {
      if (p->rc == 0 || (char)p->rc == '\x13') {
        p->rc = iVar15;
        sqlite3DbFree(db,p->zErrMsg);
        p->zErrMsg = (char *)0x0;
      }
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
      goto LAB_00130d35;
    }
  }
LAB_00130d42:
  if ((p->field_0xc6 & 0x10) != 0) {
    if (iVar12 == 2) {
      lVar20 = 0;
    }
    else {
      lVar20 = p->nChange;
      db->nTotalChange = db->nTotalChange + lVar20;
    }
    db->nChange = lVar20;
    p->nChange = 0;
  }
  sqlite3VdbeLeave(p);
LAB_00130d70:
  db->nVdbeActive = db->nVdbeActive + -1;
  bVar11 = p->field_0xc6;
  if ((bVar11 & 0x40) == 0) {
    db->nVdbeWrite = db->nVdbeWrite + -1;
    bVar11 = p->field_0xc6;
  }
  if ((char)bVar11 < '\0') {
    db->nVdbeRead = db->nVdbeRead + -1;
  }
  p->eVdbeState = '\x03';
  if (db->mallocFailed == '\0') {
    iVar15 = (uint)(p->rc == 5) * 5;
  }
  else {
    p->rc = 7;
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine.
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  assert( p->eVdbeState==VDBE_RUN_STATE );
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }
  closeAllCursors(p);
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started or if the
  ** SQL statement does not read or write a database file.  */
  if( p->bIsReader ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    if( p->rc ){
      mrc = p->rc & 0xff;
      isSpecialError = mrc==SQLITE_NOMEM
                    || mrc==SQLITE_IOERR
                    || mrc==SQLITE_INTERRUPT
                    || mrc==SQLITE_FULL;
    }else{
      mrc = isSpecialError = 0;
    }
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT,
      ** no rollback is necessary. Otherwise, at least a savepoint
      ** transaction must be rolled back to restore the database to a
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
          p->nChange = 0;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
      sqlite3VdbeCheckFk(p, 0);
    }

    /* If the auto-commit flag is set and this is the only active writer
    ** VM, then we do either a commit or rollback of the current transaction.
    **
    ** Note: This block also runs if one of the special errors handled
    ** above has occurred.
    */
    if( !sqlite3VtabInSync(db)
     && db->autoCommit
     && db->nVdbeWrite==(p->readOnly==0)
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else if( db->flags & SQLITE_CorruptRdOnly ){
          rc = SQLITE_CORRUPT;
          db->flags &= ~SQLITE_CorruptRdOnly;
        }else{
          /* The auto-commit flag is true, the vdbe program was successful
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
          p->nChange = 0;
        }else{
          db->nDeferredCons = 0;
          db->nDeferredImmCons = 0;
          db->flags &= ~(u64)SQLITE_DeferFKs;
          sqlite3CommitInternalChanges(db);
        }
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
        p->nChange = 0;
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }

    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }

    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter.
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  db->nVdbeActive--;
  if( !p->readOnly ) db->nVdbeWrite--;
  if( p->bIsReader ) db->nVdbeRead--;
  assert( db->nVdbeActive>=db->nVdbeRead );
  assert( db->nVdbeRead>=db->nVdbeWrite );
  assert( db->nVdbeWrite>=0 );
  p->eVdbeState = VDBE_HALT_STATE;
  checkActiveVdbeCnt(db);
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked()
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->nVdbeActive>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}